

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O0

t_at * __thiscall xemmai::t_code::f_at(t_code *this,void **a_address)

{
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  _Var1;
  bool bVar2;
  void **ppvVar3;
  reference local_58;
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  local_40;
  unsigned_long local_38;
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  local_30;
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  local_28;
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  local_20;
  __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
  i;
  void **a_address_local;
  t_code *this_local;
  
  i._M_current = (t_at_address *)a_address;
  local_28._M_current =
       (t_at_address *)
       std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>::
       begin(&this->v_ats);
  local_30._M_current =
       (t_at_address *)
       std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>::end
                 (&this->v_ats);
  _Var1 = i;
  ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::data(&this->v_instructions);
  local_38 = (long)_Var1._M_current - (long)ppvVar3 >> 3;
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<xemmai::t_code::t_at_address_const*,std::vector<xemmai::t_code::t_at_address,std::allocator<xemmai::t_code::t_at_address>>>,unsigned_long>
                       (local_28,local_30,&local_38);
  local_40._M_current =
       (t_at_address *)
       std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>::end
                 (&this->v_ats);
  bVar2 = __gnu_cxx::
          operator==<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
                    (&local_20,&local_40);
  if (bVar2) {
    local_58 = (reference)0x0;
  }
  else {
    local_58 = __gnu_cxx::
               __normal_iterator<const_xemmai::t_code::t_at_address_*,_std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>_>
               ::operator*(&local_20);
  }
  return &local_58->super_t_at;
}

Assistant:

const t_at* t_code::f_at(void** a_address) const
{
	auto i = std::lower_bound(v_ats.begin(), v_ats.end(), static_cast<size_t>(a_address - v_instructions.data()));
	return i == v_ats.end() ? nullptr : &*i;
}